

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O3

uintwide_t<24U,_unsigned_char,_void,_false> * __thiscall
math::wide_integer::uintwide_t<65536U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
operator%=(uintwide_t<65536U,_unsigned_int,_std::allocator<unsigned_int>,_false> *this,
          uintwide_t<24U,_unsigned_char,_void,_false> *other)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  undefined **local_30;
  ulong local_28;
  void *local_20;
  
  if (this == (uintwide_t<65536U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)other) {
    if ((ulong)*(uint *)(this + 8) != 0) {
      memset(*(void **)(this + 0x10),0,(ulong)*(uint *)(this + 8) << 2);
    }
  }
  else {
    local_28 = 0x800;
    local_20 = operator_new(0x2000);
    local_30 = &PTR__dynamic_array_002091d0;
    memset(local_20,0,0x2000);
    eval_divide_knuth(this,other,(uintwide_t<24U,_unsigned_char,_void,_false> *)&local_30);
    if ((uintwide_t<65536U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)&local_30 != this)
    {
      uVar2 = *(uint *)(this + 8);
      if ((uint)local_28 < *(uint *)(this + 8)) {
        uVar2 = (uint)local_28;
      }
      if (uVar2 != 0) {
        lVar1 = *(long *)(this + 0x10);
        lVar3 = 0;
        do {
          *(undefined4 *)(lVar1 + lVar3) = *(undefined4 *)((long)local_20 + lVar3);
          lVar3 = lVar3 + 4;
        } while ((ulong)uVar2 * 4 != lVar3);
      }
    }
    local_30 = &PTR__dynamic_array_002087f0;
    if ((local_28 & 0xffffffff) != 0) {
      operator_delete(local_20,(local_28 & 0xffffffff) << 2);
    }
  }
  return (uintwide_t<24U,_unsigned_char,_void,_false> *)this;
}

Assistant:

constexpr auto operator%=(const uintwide_t& other) -> uintwide_t&
    {
      if(this == &other)
      {
        detail::fill_unsafe(values.begin(), values.end(), static_cast<limb_type>(UINT8_C(0))); // LCOV_EXCL_LINE
      }
      else
      {
        // Unary modulus function.
        const auto numer_was_neg = is_neg(*this);
        const auto denom_was_neg = is_neg(other);

        if(numer_was_neg || denom_was_neg)
        {
          using local_unsigned_wide_type = uintwide_t<Width2, limb_type, AllocatorType, false>;

          local_unsigned_wide_type a(*this);
          local_unsigned_wide_type b(other);

          if(numer_was_neg) { a.negate(); }
          if(denom_was_neg) { b.negate(); }

          local_unsigned_wide_type remainder_unsigned { };

          a.eval_divide_knuth(b, &remainder_unsigned);

          // The sign of the remainder follows the sign of the denominator.
          if(numer_was_neg) { remainder_unsigned.negate(); }

          values = remainder_unsigned.values;
        }
        else
        {
          uintwide_t remainder { };

          eval_divide_knuth(other, &remainder);

          values = remainder.values;
        }
      }

      return *this;
    }